

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::NewFrame(void)

{
  ImVector<ImGuiContextHook> *this;
  ImVector<ImGuiViewportP_*> *pIVar1;
  ImVector<float> *this_00;
  ImVector<ImGuiTableTempData> *this_01;
  ImGuiNextWindowData *pIVar2;
  ImVector<ImGuiStackLevelInfo> *pIVar3;
  int *piVar4;
  ImVec2 *pIVar5;
  ImU16 *pIVar6;
  ImGuiNavLayer IVar7;
  ImFontAtlas *pIVar8;
  char *pcVar9;
  ImGuiViewportP *pIVar10;
  undefined1 auVar11 [12];
  ImGuiScrollFlags scroll_flags;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [12];
  undefined1 auVar15 [16];
  long lVar16;
  ImGuiContext *ctx;
  ImGuiContext *pIVar17;
  ImGuiContext *pIVar18;
  undefined3 uVar19;
  char cVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  ImU16 IVar26;
  int n_3;
  ImGuiID IVar27;
  ImGuiKeyModFlags IVar28;
  ImGuiInputSource IVar29;
  ImGuiNavLayer IVar30;
  ImGuiDir IVar31;
  ImGuiContextHook *pIVar32;
  long lVar33;
  ImGuiViewportP **ppIVar34;
  ImFont *font;
  ImGuiWindow *pIVar35;
  ImGuiPopupData *pIVar36;
  ImGuiWindow **ppIVar37;
  float *pfVar38;
  ImGuiTable *table;
  ImGuiTableTempData *pIVar39;
  ImGuiStackLevelInfo *pIVar40;
  int i;
  ImGuiID IVar41;
  ImGuiDir IVar42;
  ImGuiWindow *window_00;
  ImGuiWindow *parent;
  ImGuiWindow *pIVar43;
  int n;
  int iVar44;
  int iVar45;
  bool *pbVar46;
  float *pfVar47;
  float *pfVar48;
  ulong uVar49;
  int i_1;
  uint uVar50;
  ImGuiWindow *window;
  ImGuiWindow *old_nav_window;
  ImGuiContext *pIVar51;
  byte bVar52;
  uint uVar53;
  uint uVar54;
  float fVar55;
  ImVec2 IVar57;
  ImVec2 IVar58;
  float fVar56;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  ImVec2 IVar59;
  ImVec2 IVar60;
  undefined1 auVar61 [12];
  undefined1 auVar62 [16];
  float fVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar67;
  float fVar70;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  ImRect IVar71;
  float local_b8;
  char local_a8;
  ImRect child_rect;
  float local_68;
  float fStack_60;
  float fStack_5c;
  ImRect local_48;
  long local_38;
  
  ctx = GImGui;
  bVar52 = 0;
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x107e,"void ImGui::NewFrame()");
  }
  this = &GImGui->Hooks;
  iVar44 = (GImGui->Hooks).Size;
  while (0 < iVar44) {
    iVar44 = iVar44 + -1;
    pIVar32 = ImVector<ImGuiContextHook>::operator[](this,iVar44);
    if (*(int *)(pIVar32 + 4) == 7) {
      pIVar32 = ImVector<ImGuiContextHook>::operator[](this,iVar44);
      ImVector<ImGuiContextHook>::erase(this,pIVar32);
    }
  }
  CallContextHooks(ctx,ImGuiContextHookType_NewFramePre);
  pIVar51 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x1f01,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  iVar44 = GImGui->FrameCount;
  if ((GImGui->IO).DeltaTime <= 0.0) {
    if (iVar44 != 0) {
      __assert_fail("(g.IO.DeltaTime > 0.0f || g.FrameCount == 0) && \"Need a positive DeltaTime!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                    ,0x1f02,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
  }
  else if ((iVar44 != 0) && (GImGui->FrameCountEnded != iVar44)) {
    __assert_fail("(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x1f03,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || ((GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x1f04,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  pIVar8 = (GImGui->IO).Fonts;
  if (((pIVar8->Fonts).Size < 1) || ((pIVar8->TexReady & 1U) == 0)) {
    __assert_fail("g.IO.Fonts->IsBuilt() && \"Font Atlas not built! Make sure you called ImGui_ImplXXXX_NewFrame() function for renderer backend, which should call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8()\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x1f05,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x1f06,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->Style).CircleTessellationMaxError <= 0.0) {
    __assert_fail("g.Style.CircleTessellationMaxError > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x1f07,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  fVar55 = (GImGui->Style).Alpha;
  if ((fVar55 < 0.0) || (1.0 < fVar55)) {
    __assert_fail("g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x1f08,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->Style).WindowMinSize.x < 1.0) || ((GImGui->Style).WindowMinSize.y < 1.0)) {
    __assert_fail("g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && \"Invalid style setting.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x1f09,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (2 < (GImGui->Style).WindowMenuButtonPosition + 1U) {
    __assert_fail("g.Style.WindowMenuButtonPosition == ImGuiDir_None || g.Style.WindowMenuButtonPosition == ImGuiDir_Left || g.Style.WindowMenuButtonPosition == ImGuiDir_Right"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x1f0a,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  lVar33 = 0;
  while (lVar33 != 0x85) {
    lVar16 = lVar33 + 0x200;
    lVar33 = lVar33 + 1;
    if (0x200 < (GImGui->IO).KeyMap[lVar16] + 1U) {
      __assert_fail("g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < ((int)(sizeof(g.IO.KeysDown) / sizeof(*(g.IO.KeysDown)))) && \"io.KeyMap[] contains an out of bound value (need to be 0..511, or -1 for unmapped key)\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                    ,0x1f0d,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
  }
  if (((((GImGui->IO).ConfigFlags & 1) != 0) && ((GImGui->IO).BackendUsingLegacyKeyArrays == '\x01')
      ) && ((GImGui->IO).KeyMap[0x20c] == -1)) {
    __assert_fail("g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x1f11,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).ConfigWindowsResizeFromEdges == true) && (((GImGui->IO).BackendFlags & 2) == 0))
  {
    (GImGui->IO).ConfigWindowsResizeFromEdges = false;
  }
  if (pIVar51->SettingsLoaded == false) {
    if ((pIVar51->SettingsWindows).Buf.Size != 0) {
      __assert_fail("g.SettingsWindows.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                    ,0x2ce4,"void ImGui::UpdateSettings()");
    }
    pcVar9 = (pIVar51->IO).IniFilename;
    if (pcVar9 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar9);
    }
    pIVar51->SettingsLoaded = true;
  }
  if ((0.0 < pIVar51->SettingsDirtyTimer) &&
     (fVar55 = pIVar51->SettingsDirtyTimer - (pIVar51->IO).DeltaTime,
     pIVar51->SettingsDirtyTimer = fVar55, fVar55 <= 0.0)) {
    pcVar9 = (pIVar51->IO).IniFilename;
    if (pcVar9 == (char *)0x0) {
      (pIVar51->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar9);
    }
    pIVar51->SettingsDirtyTimer = 0.0;
  }
  ctx->Time = (double)(ctx->IO).DeltaTime + ctx->Time;
  ctx->WithinFrameScope = true;
  ctx->FrameCount = ctx->FrameCount + 1;
  ctx->TooltipOverrideCount = 0;
  ctx->WindowsActiveCount = 0;
  iVar45 = 0;
  ImVector<unsigned_int>::resize(&ctx->MenusIdSubmittedThisFrame,0);
  fVar55 = (ctx->IO).DeltaTime;
  iVar44 = ctx->FramerateSecPerFrameIdx;
  ctx->FramerateSecPerFrameAccum =
       (fVar55 - ctx->FramerateSecPerFrame[iVar44]) + ctx->FramerateSecPerFrameAccum;
  ctx->FramerateSecPerFrame[iVar44] = fVar55;
  ctx->FramerateSecPerFrameIdx = (iVar44 + 1) % 0x78;
  iVar44 = 0x77;
  if (ctx->FramerateSecPerFrameCount < 0x77) {
    iVar44 = ctx->FramerateSecPerFrameCount;
  }
  ctx->FramerateSecPerFrameCount = iVar44 + 1;
  uVar53 = -(uint)(0.0 < ctx->FramerateSecPerFrameAccum);
  (ctx->IO).Framerate =
       (float)(~uVar53 & 0x7f7fffff |
              (uint)(1.0 / (ctx->FramerateSecPerFrameAccum / (float)(iVar44 + 1))) & uVar53);
  pIVar51 = GImGui;
  if ((GImGui->Viewports).Size != 1) {
    __assert_fail("g.Viewports.Size == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x2e14,"void ImGui::UpdateViewportsNewFrame()");
  }
  pIVar1 = &GImGui->Viewports;
  ppIVar34 = ImVector<ImGuiViewportP_*>::operator[](pIVar1,0);
  pIVar10 = *ppIVar34;
  (pIVar10->super_ImGuiViewport).Flags = 5;
  (pIVar10->super_ImGuiViewport).Pos.x = 0.0;
  (pIVar10->super_ImGuiViewport).Pos.y = 0.0;
  (pIVar10->super_ImGuiViewport).Size = (pIVar51->IO).DisplaySize;
  for (; iVar45 < pIVar1->Size; iVar45 = iVar45 + 1) {
    ppIVar34 = ImVector<ImGuiViewportP_*>::operator[](pIVar1,iVar45);
    pIVar10 = *ppIVar34;
    pIVar10->WorkOffsetMin = pIVar10->BuildWorkOffsetMin;
    pIVar10->WorkOffsetMax = pIVar10->BuildWorkOffsetMax;
    (pIVar10->BuildWorkOffsetMin).x = 0.0;
    (pIVar10->BuildWorkOffsetMin).y = 0.0;
    (pIVar10->BuildWorkOffsetMax).x = 0.0;
    (pIVar10->BuildWorkOffsetMax).y = 0.0;
    ImGuiViewportP::UpdateWorkRect(pIVar10);
  }
  ((ctx->IO).Fonts)->Locked = true;
  font = GetDefaultFont();
  SetCurrentFont(font);
  if (ctx->Font->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.Font->IsLoaded()",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x10a2,"void ImGui::NewFrame()");
  }
  pIVar1 = &ctx->Viewports;
  fVar55 = 3.4028235e+38;
  fVar63 = 3.4028235e+38;
  fVar56 = -3.4028235e+38;
  fVar70 = -3.4028235e+38;
  for (iVar44 = 0; iVar44 < pIVar1->Size; iVar44 = iVar44 + 1) {
    ppIVar34 = ImVector<ImGuiViewportP_*>::operator[](pIVar1,iVar44);
    IVar71 = ImGuiViewportP::GetMainRect(*ppIVar34);
    fVar67 = IVar71.Min.x;
    if (fVar55 <= IVar71.Min.x) {
      fVar67 = fVar55;
    }
    fVar55 = IVar71.Min.y;
    if (fVar63 <= IVar71.Min.y) {
      fVar55 = fVar63;
    }
    if (fVar56 < IVar71.Max.x) {
      auVar61._4_4_ = fVar55;
      auVar61._0_4_ = fVar67;
      auVar61._8_4_ = IVar71.Max.x;
    }
    else {
      auVar61._4_4_ = fVar55;
      auVar61._0_4_ = fVar67;
      auVar61._8_4_ = fVar56;
    }
    fVar55 = auVar61._0_4_;
    fVar63 = auVar61._4_4_;
    fVar56 = auVar61._8_4_;
    if (fVar70 < IVar71.Max.y) {
      fVar70 = IVar71.Max.y;
    }
  }
  (ctx->DrawListSharedData).ClipRectFullscreen.x = fVar55;
  (ctx->DrawListSharedData).ClipRectFullscreen.y = fVar63;
  (ctx->DrawListSharedData).ClipRectFullscreen.z = fVar56;
  (ctx->DrawListSharedData).ClipRectFullscreen.w = fVar70;
  fVar55 = (ctx->Style).CircleTessellationMaxError;
  (ctx->DrawListSharedData).CurveTessellationTol = (ctx->Style).CurveTessellationTol;
  ImDrawListSharedData::SetCircleTessellationMaxError(&ctx->DrawListSharedData,fVar55);
  bVar21 = (ctx->Style).AntiAliasedLines;
  uVar53 = (uint)bVar21;
  (ctx->DrawListSharedData).InitialFlags = (uint)bVar21;
  if (((ctx->Style).AntiAliasedLinesUseTex != false) &&
     ((ctx->Font->ContainerAtlas->Flags & 4) == 0)) {
    uVar53 = bVar21 | 2;
    (ctx->DrawListSharedData).InitialFlags = uVar53;
  }
  if ((ctx->Style).AntiAliasedFill == true) {
    uVar53 = uVar53 | 4;
    (ctx->DrawListSharedData).InitialFlags = uVar53;
  }
  if (((ctx->IO).BackendFlags & 8) != 0) {
    (ctx->DrawListSharedData).InitialFlags = uVar53 | 8;
  }
  for (iVar44 = 0; iVar44 < pIVar1->Size; iVar44 = iVar44 + 1) {
    ppIVar34 = ImVector<ImGuiViewportP_*>::operator[](pIVar1,iVar44);
    pIVar10 = *ppIVar34;
    (pIVar10->DrawDataP).Valid = false;
    *(undefined3 *)&(pIVar10->DrawDataP).field_0x1 = 0;
    (pIVar10->DrawDataP).CmdListsCount = 0;
    (pIVar10->DrawDataP).TotalIdxCount = 0;
    (pIVar10->DrawDataP).TotalVtxCount = 0;
    (pIVar10->DrawDataP).CmdLists = (ImDrawList **)0x0;
    (pIVar10->DrawDataP).DisplayPos.x = 0.0;
    (pIVar10->DrawDataP).DisplayPos.y = 0.0;
    (pIVar10->DrawDataP).DisplaySize.x = 0.0;
    (pIVar10->DrawDataP).DisplaySize.y = 0.0;
    (pIVar10->DrawDataP).FramebufferScale.x = 0.0;
    (pIVar10->DrawDataP).FramebufferScale.y = 0.0;
  }
  if ((ctx->DragDropActive != false) &&
     (IVar41 = (ctx->DragDropPayload).SourceId, IVar41 == ctx->ActiveId)) {
    KeepAliveID(IVar41);
  }
  if (ctx->HoveredIdPreviousFrame == 0) {
    IVar41 = ctx->HoveredId;
    ctx->HoveredIdTimer = 0.0;
    ctx->HoveredIdNotActiveTimer = 0.0;
    if (IVar41 == 0) goto LAB_00132534;
LAB_0013250d:
    fVar55 = (ctx->IO).DeltaTime;
    ctx->HoveredIdTimer = ctx->HoveredIdTimer + fVar55;
    IVar27 = IVar41;
    if (ctx->ActiveId != IVar41) {
      ctx->HoveredIdNotActiveTimer = fVar55 + ctx->HoveredIdNotActiveTimer;
      IVar27 = ctx->ActiveId;
    }
  }
  else {
    IVar41 = ctx->HoveredId;
    if (IVar41 != 0) {
      if (ctx->ActiveId == IVar41) {
        ctx->HoveredIdNotActiveTimer = 0.0;
      }
      goto LAB_0013250d;
    }
LAB_00132534:
    IVar41 = 0;
    IVar27 = ctx->ActiveId;
  }
  ctx->HoveredIdPreviousFrame = IVar41;
  ctx->HoveredIdPreviousFrameUsingMouseWheel = ctx->HoveredIdUsingMouseWheel;
  ctx->HoveredId = 0;
  ctx->HoveredIdAllowOverlap = false;
  ctx->HoveredIdUsingMouseWheel = false;
  ctx->HoveredIdDisabled = false;
  if (((ctx->ActiveIdIsAlive != IVar27) && (IVar27 != 0)) && (ctx->ActiveIdPreviousFrame == IVar27))
  {
    ClearActiveID();
    IVar27 = ctx->ActiveId;
  }
  fVar55 = (ctx->IO).DeltaTime;
  if (IVar27 != 0) {
    ctx->ActiveIdTimer = ctx->ActiveIdTimer + fVar55;
  }
  ctx->LastActiveIdTimer = fVar55 + ctx->LastActiveIdTimer;
  ctx->ActiveIdPreviousFrame = IVar27;
  ctx->ActiveIdPreviousFrameWindow = ctx->ActiveIdWindow;
  ctx->ActiveIdPreviousFrameHasBeenEditedBefore = ctx->ActiveIdHasBeenEditedBefore;
  ctx->ActiveIdIsAlive = 0;
  ctx->ActiveIdHasBeenEditedThisFrame = false;
  ctx->ActiveIdPreviousFrameIsAlive = false;
  ctx->ActiveIdIsJustActivated = false;
  if (ctx->TempInputId == 0) {
LAB_00132612:
    if (IVar27 == 0) {
      (ctx->ActiveIdUsingKeyInputMask).Storage[1] = 0;
      (ctx->ActiveIdUsingKeyInputMask).Storage[2] = 0;
      (ctx->ActiveIdUsingKeyInputMask).Storage[3] = 0;
      (ctx->ActiveIdUsingKeyInputMask).Storage[4] = 0;
      ctx->ActiveIdUsingNavDirMask = 0;
      ctx->ActiveIdUsingNavInputMask = 0;
      (ctx->ActiveIdUsingKeyInputMask).Storage[0] = 0;
      (ctx->ActiveIdUsingKeyInputMask).Storage[1] = 0;
    }
  }
  else if (IVar27 != ctx->TempInputId) {
    ctx->TempInputId = 0;
    goto LAB_00132612;
  }
  ctx->DragDropAcceptIdPrev = ctx->DragDropAcceptIdCurr;
  ctx->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  ctx->DragDropAcceptIdCurr = 0;
  ctx->DragDropWithinSource = false;
  ctx->DragDropWithinTarget = false;
  ctx->DragDropHoldJustPressedId = 0;
  ImVector<ImGuiInputEvent>::resize(&ctx->InputEventsTrail,0);
  UpdateInputEvents((ctx->IO).ConfigInputTrickleEventQueue);
  pIVar51 = GImGui;
  IVar28 = GetMergedKeyModFlags();
  (pIVar51->IO).KeyMods = IVar28;
  cVar20 = (pIVar51->IO).BackendUsingLegacyKeyArrays;
  if (cVar20 == '\0') {
    lVar33 = 0;
    while (lVar33 != 0x200) {
      pbVar46 = (pIVar51->IO).KeysDown + lVar33;
      lVar33 = lVar33 + 1;
      if (*pbVar46 != false) {
        __assert_fail("io.KeysDown[n] == false && \"Backend needs to either only use io.AddKeyEvent(), either only fill legacy io.KeysDown[] + io.KeyMap[]. Not both!\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                      ,0xf54,"void ImGui::UpdateKeyboardInputs()");
      }
    }
  }
  else {
    if (pIVar51->FrameCount == 0) {
      lVar33 = 0;
      while (lVar33 != 0x200) {
        piVar4 = (pIVar51->IO).KeyMap + lVar33;
        lVar33 = lVar33 + 1;
        if (*piVar4 != -1) {
          __assert_fail("g.IO.KeyMap[n] == -1 && \"Backend is not allowed to write to io.KeyMap[0..511]!\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                        ,0xf5a,"void ImGui::UpdateKeyboardInputs()");
        }
      }
    }
    for (lVar33 = 0; lVar33 != 0x85; lVar33 = lVar33 + 1) {
      uVar53 = (pIVar51->IO).KeyMap[lVar33 + 0x200];
      if ((ulong)uVar53 != 0xffffffff) {
        if (0x1ff < uVar53) {
          __assert_fail("IsLegacyKey((ImGuiKey)io.KeyMap[n])",
                        "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                        ,0xf60,"void ImGui::UpdateKeyboardInputs()");
        }
        (pIVar51->IO).KeyMap[uVar53] = (int)lVar33 + 0x200;
      }
    }
    for (lVar33 = 0; lVar33 != 0x200; lVar33 = lVar33 + 1) {
      bVar21 = (pIVar51->IO).KeysDown[lVar33];
      if ((cVar20 == '\x01' | bVar21) == 1) {
        iVar44 = (pIVar51->IO).KeyMap[lVar33];
        if (0x84 < iVar44 - 0x200U && iVar44 != -1) {
          __assert_fail("io.KeyMap[n] == -1 || IsNamedKey(key)",
                        "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                        ,0xf69,"void ImGui::UpdateKeyboardInputs()");
        }
        iVar45 = (int)lVar33;
        if (iVar44 != -1) {
          iVar45 = iVar44;
        }
        (pIVar51->IO).KeysData[iVar45].Down = bVar21;
        (pIVar51->IO).BackendUsingLegacyKeyArrays = '\x01';
        cVar20 = '\x01';
      }
    }
    if (cVar20 == '\x01') {
      bVar21 = (pIVar51->IO).KeyShift;
      (pIVar51->IO).KeysData[0x281].Down = (pIVar51->IO).KeyCtrl;
      (pIVar51->IO).KeysData[0x282].Down = bVar21;
      (pIVar51->IO).KeysData[0x283].Down = (pIVar51->IO).KeyAlt;
      (pIVar51->IO).KeysData[0x284].Down = (pIVar51->IO).KeySuper;
    }
  }
  uVar53 = (pIVar51->IO).BackendFlags;
  if ((uVar53 & 1) == 0) {
    for (lVar33 = 0; lVar33 != 0x180; lVar33 = lVar33 + 0x10) {
      (&(pIVar51->IO).KeysData[0x269].Down)[lVar33] = false;
      *(undefined4 *)((long)&(pIVar51->IO).KeysData[0x269].AnalogValue + lVar33) = 0;
    }
  }
  for (lVar33 = 0xd88; lVar33 != 0x35d8; lVar33 = lVar33 + 0x10) {
    fVar55 = *(float *)((long)pIVar51 + lVar33 + -4);
    *(float *)(&pIVar51->Initialized + lVar33) = fVar55;
    fVar63 = -1.0;
    if ((*(char *)((long)pIVar51 + lVar33 + -8) == '\x01') && (fVar63 = 0.0, 0.0 <= fVar55)) {
      fVar63 = fVar55 + (pIVar51->IO).DeltaTime;
    }
    *(float *)((long)pIVar51 + lVar33 + -4) = fVar63;
  }
  (pIVar51->IO).WantSetMousePos = false;
  uVar50 = (pIVar51->IO).ConfigFlags;
  uVar53 = uVar53 & (uVar50 & 2) >> 1;
  if ((uVar53 == 1) && ((pIVar51->IO).BackendUsingLegacyNavInputArray == false)) {
    lVar33 = 0;
    while (lVar33 != 0x14) {
      fVar55 = (pIVar51->IO).NavInputs[lVar33];
      lVar33 = lVar33 + 1;
      if ((fVar55 != 0.0) || (NAN(fVar55))) {
        __assert_fail("io.NavInputs[n] == 0.0f && \"Backend needs to either only use io.AddKeyEvent()/io.AddKeyAnalogEvent(), either only fill legacy io.NavInputs[]. Not both!\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                      ,0x273c,"void ImGui::NavUpdate()");
      }
    }
    fVar55 = (pIVar51->IO).KeysData[0x26c].AnalogValue;
    (pIVar51->IO).NavInputs[0] = fVar55;
    if (0.0 < fVar55) {
      pIVar51->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar55 = (pIVar51->IO).KeysData[0x26e].AnalogValue;
    (pIVar51->IO).NavInputs[1] = fVar55;
    if (0.0 < fVar55) {
      pIVar51->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar55 = (pIVar51->IO).KeysData[0x26d].AnalogValue;
    (pIVar51->IO).NavInputs[3] = fVar55;
    if (0.0 < fVar55) {
      pIVar51->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar55 = (pIVar51->IO).KeysData[0x26b].AnalogValue;
    (pIVar51->IO).NavInputs[2] = fVar55;
    if (0.0 < fVar55) {
      pIVar51->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar55 = (pIVar51->IO).KeysData[0x271].AnalogValue;
    (pIVar51->IO).NavInputs[4] = fVar55;
    if (0.0 < fVar55) {
      pIVar51->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar55 = (pIVar51->IO).KeysData[0x272].AnalogValue;
    (pIVar51->IO).NavInputs[5] = fVar55;
    if (0.0 < fVar55) {
      pIVar51->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar55 = (pIVar51->IO).KeysData[0x26f].AnalogValue;
    (pIVar51->IO).NavInputs[6] = fVar55;
    if (0.0 < fVar55) {
      pIVar51->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar55 = (pIVar51->IO).KeysData[0x270].AnalogValue;
    (pIVar51->IO).NavInputs[7] = fVar55;
    if (0.0 < fVar55) {
      pIVar51->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar55 = (pIVar51->IO).KeysData[0x273].AnalogValue;
    fVar63 = (pIVar51->IO).KeysData[0x274].AnalogValue;
    (pIVar51->IO).NavInputs[0xc] = fVar55;
    (pIVar51->IO).NavInputs[0xd] = fVar63;
    (pIVar51->IO).NavInputs[0xe] = fVar55;
    (pIVar51->IO).NavInputs[0xf] = fVar63;
    (pIVar51->IO).NavInputs[8] = (pIVar51->IO).KeysData[0x27b].AnalogValue;
    (pIVar51->IO).NavInputs[9] = (pIVar51->IO).KeysData[0x27c].AnalogValue;
    (pIVar51->IO).NavInputs[10] = (pIVar51->IO).KeysData[0x279].AnalogValue;
    (pIVar51->IO).NavInputs[0xb] = (pIVar51->IO).KeysData[0x27a].AnalogValue;
  }
  if ((uVar50 & 1) != 0) {
    bVar21 = IsKeyDown(0x20c);
    if (bVar21) {
      (pIVar51->IO).NavInputs[0] = 1.0;
      pIVar51->NavInputSource = ImGuiInputSource_Keyboard;
    }
    bVar21 = IsKeyDown(0x20d);
    if (bVar21) {
      (pIVar51->IO).NavInputs[2] = 1.0;
      pIVar51->NavInputSource = ImGuiInputSource_Keyboard;
    }
    bVar21 = IsKeyDown(0x20e);
    if (bVar21) {
      (pIVar51->IO).NavInputs[1] = 1.0;
      pIVar51->NavInputSource = ImGuiInputSource_Keyboard;
    }
    bVar21 = IsKeyDown(0x201);
    if (bVar21) {
      (pIVar51->IO).NavInputs[0x10] = 1.0;
      pIVar51->NavInputSource = ImGuiInputSource_Keyboard;
    }
    bVar21 = IsKeyDown(0x202);
    if (bVar21) {
      (pIVar51->IO).NavInputs[0x11] = 1.0;
      pIVar51->NavInputSource = ImGuiInputSource_Keyboard;
    }
    bVar21 = IsKeyDown(0x203);
    if (bVar21) {
      (pIVar51->IO).NavInputs[0x12] = 1.0;
      pIVar51->NavInputSource = ImGuiInputSource_Keyboard;
    }
    bVar21 = IsKeyDown(0x204);
    if (bVar21) {
      (pIVar51->IO).NavInputs[0x13] = 1.0;
      pIVar51->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if ((pIVar51->IO).KeyCtrl == true) {
      (pIVar51->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar51->IO).KeyShift == true) {
      (pIVar51->IO).NavInputs[0xf] = 1.0;
    }
  }
  pfVar38 = (pIVar51->IO).NavInputsDownDuration;
  pfVar47 = pfVar38;
  pfVar48 = (pIVar51->IO).NavInputsDownDurationPrev;
  for (lVar33 = 0x14; lVar33 != 0; lVar33 = lVar33 + -1) {
    *pfVar48 = *pfVar47;
    pfVar47 = pfVar47 + (ulong)bVar52 * -2 + 1;
    pfVar48 = pfVar48 + (ulong)bVar52 * -2 + 1;
  }
  for (lVar33 = 0; lVar33 != 0x14; lVar33 = lVar33 + 1) {
    fVar55 = -1.0;
    if (0.0 < (pIVar51->IO).NavInputs[lVar33]) {
      fVar55 = 0.0;
      if (0.0 <= pfVar38[lVar33]) {
        fVar55 = pfVar38[lVar33] + (pIVar51->IO).DeltaTime;
      }
    }
    pfVar38[lVar33] = fVar55;
  }
  if (pIVar51->NavInitResultId != 0) {
    NavInitRequestApplyResult();
  }
  pIVar51->NavInitRequest = false;
  pIVar51->NavInitRequestFromMove = false;
  pIVar51->NavInitResultId = 0;
  pIVar51->NavJustMovedToId = 0;
  if (pIVar51->NavMoveSubmitted == true) {
    NavMoveRequestApplyResult();
  }
  pIVar51->NavTabbingCounter = 0;
  pIVar51->NavMoveSubmitted = false;
  pIVar51->NavMoveScoringItems = false;
  if ((((pIVar51->NavMousePosDirty == true) && (pIVar51->NavIdIsAlive == true)) &&
      (pIVar51->NavDisableHighlight == false)) && (pIVar51->NavDisableMouseHover == true)) {
    bVar21 = pIVar51->NavWindow != (ImGuiWindow *)0x0;
  }
  else {
    bVar21 = false;
  }
  pIVar51->NavMousePosDirty = false;
  IVar30 = pIVar51->NavLayer;
  if (ImGuiNavLayer_Menu < IVar30) {
    __assert_fail("g.NavLayer == ImGuiNavLayer_Main || g.NavLayer == ImGuiNavLayer_Menu",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x277b,"void ImGui::NavUpdate()");
  }
  pIVar35 = pIVar51->NavWindow;
  pIVar43 = pIVar35;
  if (pIVar35 != (ImGuiWindow *)0x0) {
    for (; pIVar43 != (ImGuiWindow *)0x0; pIVar43 = pIVar43->ParentWindow) {
      if ((pIVar43->RootWindow == pIVar43) || ((pIVar43->Flags & 0x14000000) != 0)) {
        if (pIVar43 != pIVar35) {
          pIVar43->NavLastChildNavWindow = pIVar35;
        }
        break;
      }
    }
    if ((IVar30 == ImGuiNavLayer_Main) && (pIVar35->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
      pIVar35->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar18 = GImGui;
  pIVar35 = GetTopMostPopupModal();
  if (pIVar35 != (ImGuiWindow *)0x0) {
    pIVar18->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((pIVar18->NavWindowingTargetAnim != (ImGuiWindow *)0x0) &&
     (pIVar18->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar55 = (pIVar18->IO).DeltaTime * -10.0 + pIVar18->NavWindowingHighlightAlpha;
    fVar55 = (float)(-(uint)(0.0 <= fVar55) & (uint)fVar55);
    pIVar18->NavWindowingHighlightAlpha = fVar55;
    if ((pIVar18->DimBgRatio <= 0.0) && (fVar55 <= 0.0)) {
      pIVar18->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
    }
  }
  if ((pIVar35 == (ImGuiWindow *)0x0) && (pIVar18->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    bVar22 = IsNavInputTest(3,ImGuiInputReadMode_Pressed);
    if ((pIVar18->NavWindowingTarget != (ImGuiWindow *)0x0) || ((pIVar18->IO).KeyCtrl != true))
    goto LAB_00132d84;
    bVar23 = IsKeyPressed(0x200,true);
  }
  else {
    bVar22 = false;
LAB_00132d84:
    bVar23 = false;
  }
  if (((bVar22 | bVar23) == 1) &&
     ((pIVar35 = pIVar18->NavWindow, pIVar35 != (ImGuiWindow *)0x0 ||
      (pIVar35 = FindWindowNavFocusable((pIVar18->WindowsFocusOrder).Size + -1,-0x7fffffff,-1),
      pIVar35 != (ImGuiWindow *)0x0)))) {
    pIVar35 = pIVar35->RootWindow;
    pIVar18->NavWindowingTargetAnim = pIVar35;
    pIVar18->NavWindowingTarget = pIVar35;
    pIVar18->NavWindowingTimer = 0.0;
    pIVar18->NavWindowingHighlightAlpha = 0.0;
    pIVar18->NavWindowingToggleLayer = bVar22;
    pIVar18->NavInputSource = bVar23 ^ ImGuiInputSource_Gamepad;
  }
  fVar55 = (pIVar18->IO).DeltaTime + pIVar18->NavWindowingTimer;
  pIVar18->NavWindowingTimer = fVar55;
  if (pIVar18->NavWindowingTarget == (ImGuiWindow *)0x0) {
LAB_00132f7e:
    bVar22 = false;
    pIVar35 = (ImGuiWindow *)0x0;
  }
  else {
    IVar29 = pIVar18->NavInputSource;
    if (IVar29 != ImGuiInputSource_Gamepad) {
LAB_00132ee9:
      if (IVar29 == ImGuiInputSource_Keyboard) {
        fVar63 = (pIVar18->NavWindowingTimer + -0.2) / 0.05;
        fVar55 = 1.0;
        if (fVar63 <= 1.0) {
          fVar55 = fVar63;
        }
        fVar55 = (float)(~-(uint)(fVar63 < 0.0) & (uint)fVar55);
        uVar54 = -(uint)(fVar55 <= pIVar18->NavWindowingHighlightAlpha);
        pIVar18->NavWindowingHighlightAlpha =
             (float)(uVar54 & (uint)pIVar18->NavWindowingHighlightAlpha | ~uVar54 & (uint)fVar55);
        bVar22 = IsKeyPressed(0x200,true);
        if (bVar22) {
          NavUpdateWindowingHighlightWindow((pIVar18->IO).KeyShift - 1 | 1);
        }
        if ((pIVar18->IO).KeyCtrl == false) {
          pIVar35 = pIVar18->NavWindowingTarget;
          bVar22 = false;
          goto LAB_00132f83;
        }
      }
      goto LAB_00132f7e;
    }
    fVar63 = (fVar55 + -0.2) / 0.05;
    fVar55 = 1.0;
    if (fVar63 <= 1.0) {
      fVar55 = fVar63;
    }
    fVar55 = (float)(~-(uint)(fVar63 < 0.0) & (uint)fVar55);
    uVar54 = -(uint)(fVar55 <= pIVar18->NavWindowingHighlightAlpha);
    pIVar18->NavWindowingHighlightAlpha =
         (float)(uVar54 & (uint)pIVar18->NavWindowingHighlightAlpha | ~uVar54 & (uint)fVar55);
    bVar22 = IsNavInputTest(0xc,ImGuiInputReadMode_RepeatSlow);
    bVar23 = IsNavInputTest(0xd,ImGuiInputReadMode_RepeatSlow);
    if ((uint)bVar22 - (uint)bVar23 != 0) {
      NavUpdateWindowingHighlightWindow((uint)bVar22 - (uint)bVar23);
      pIVar18->NavWindowingHighlightAlpha = 1.0;
    }
    if (0.0 < (GImGui->IO).NavInputs[3]) {
      if (pIVar18->NavWindowingTarget == (ImGuiWindow *)0x0) goto LAB_00132f7e;
      IVar29 = pIVar18->NavInputSource;
      goto LAB_00132ee9;
    }
    pbVar46 = &pIVar18->NavWindowingToggleLayer;
    *pbVar46 = (bool)(*pbVar46 &
                     (pIVar18->NavWindowingHighlightAlpha <= 1.0 &&
                     pIVar18->NavWindowingHighlightAlpha != 1.0));
    if (*pbVar46 == false) {
      pIVar35 = pIVar18->NavWindowingTarget;
      bVar22 = false;
    }
    else {
      bVar22 = pIVar18->NavWindow != (ImGuiWindow *)0x0;
      pIVar35 = (ImGuiWindow *)0x0;
    }
    pIVar18->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
LAB_00132f83:
  if (((((pIVar18->IO).ConfigFlags & 1) != 0) && ((pIVar18->IO).KeyMods == 4)) &&
     (((pIVar18->IO).KeyModsPrev & 4) == 0)) {
    pIVar18->NavWindowingToggleLayer = true;
    pIVar18->NavInputSource = ImGuiInputSource_Keyboard;
  }
  if ((pIVar18->NavWindowingToggleLayer == true) &&
     (pIVar18->NavInputSource == ImGuiInputSource_Keyboard)) {
    if (((0 < (pIVar18->IO).InputQueueCharacters.Size) ||
        (((pIVar18->IO).KeyCtrl != false || ((pIVar18->IO).KeyShift != false)))) ||
       (bVar23 = true, (pIVar18->IO).KeySuper == true)) {
      pIVar18->NavWindowingToggleLayer = false;
      bVar23 = false;
    }
    if ((((((pIVar18->IO).KeyMods & 4) == 0) && (((pIVar18->IO).KeyModsPrev & 4) != 0)) && (bVar23))
       && ((pIVar18->ActiveId == 0 || (pIVar18->ActiveIdAllowOverlap == true)))) {
      bVar23 = IsMousePosValid(&(pIVar18->IO).MousePos);
      bVar24 = IsMousePosValid(&(pIVar18->IO).MousePosPrev);
      bVar22 = (bool)(bVar22 | bVar24 == bVar23);
    }
    if ((pIVar18->IO).KeyAlt == false) {
      pIVar18->NavWindowingToggleLayer = false;
    }
  }
  if ((pIVar18->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     ((pIVar18->NavWindowingTarget->Flags & 4) == 0)) {
    IVar29 = pIVar18->NavInputSource;
    IVar57.x = 0.0;
    IVar57.y = 0.0;
    IVar58.x = 0.0;
    IVar58.y = 0.0;
    if (IVar29 == ImGuiInputSource_Keyboard) {
      if ((pIVar18->IO).KeyShift == false) {
        IVar57 = GetNavInputAmount2d(1,ImGuiInputReadMode_Down,0.0,0.0);
        IVar29 = pIVar18->NavInputSource;
        goto LAB_001330c3;
      }
    }
    else {
LAB_001330c3:
      IVar58 = IVar57;
      if (IVar29 == ImGuiInputSource_Gamepad) {
        IVar58 = GetNavInputAmount2d(8,ImGuiInputReadMode_Down,0.0,0.0);
      }
    }
    IVar71 = child_rect;
    fVar55 = IVar58.y;
    if (((IVar58.x != 0.0) || (fVar55 != 0.0)) || (NAN(fVar55))) {
      fVar63 = (pIVar18->IO).DisplayFramebufferScale.x;
      fVar56 = (pIVar18->IO).DisplayFramebufferScale.y;
      if (fVar56 <= fVar63) {
        fVar63 = fVar56;
      }
      fVar63 = (float)(int)(fVar63 * (pIVar18->IO).DeltaTime * 800.0);
      pIVar43 = pIVar18->NavWindowingTarget->RootWindow;
      child_rect.Min.y = (pIVar43->Pos).y + fVar55 * fVar63;
      child_rect.Min.x = (pIVar43->Pos).x + IVar58.x * fVar63;
      child_rect.Max = IVar71.Max;
      SetWindowPos(pIVar43,&child_rect.Min,1);
      MarkIniSettingsDirty(pIVar43);
      pIVar18->NavDisableMouseHover = true;
    }
  }
  if (pIVar35 != (ImGuiWindow *)0x0) {
    if ((pIVar18->NavWindow == (ImGuiWindow *)0x0) || (pIVar35 != pIVar18->NavWindow->RootWindow)) {
      ClearActiveID();
      pIVar17 = GImGui;
      pIVar17->NavMousePosDirty = true;
      pIVar17->NavDisableHighlight = false;
      pIVar17->NavDisableMouseHover = true;
      pIVar43 = pIVar35->NavLastChildNavWindow;
      if ((pIVar43 == (ImGuiWindow *)0x0) || (pIVar43->WasActive == false)) {
        pIVar43 = pIVar35;
      }
      ClosePopupsOverWindow(pIVar43,false);
      FocusWindow(pIVar43);
      if (pIVar43->NavLastIds[0] == 0) {
        NavInitWindow(pIVar43,false);
      }
      if ((pIVar43->DC).NavLayersActiveMaskNext == 2) {
        pIVar18->NavLayer = ImGuiNavLayer_Menu;
      }
    }
    pIVar18->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((bVar22) && (pIVar18->NavWindow != (ImGuiWindow *)0x0)) {
    IVar30 = ImGuiNavLayer_Menu;
    ClearActiveID();
    pIVar35 = pIVar18->NavWindow;
    pIVar43 = pIVar35;
    do {
      window_00 = pIVar43;
      if ((window_00->ParentWindow == (ImGuiWindow *)0x0) ||
         (((window_00->DC).NavLayersActiveMask & 2) != 0)) break;
      pIVar43 = window_00->ParentWindow;
    } while ((window_00->Flags & 0x15000000U) == 0x1000000);
    if (window_00 != pIVar35) {
      FocusWindow(window_00);
      window_00->NavLastChildNavWindow = pIVar35;
      pIVar35 = pIVar18->NavWindow;
    }
    IVar7 = pIVar18->NavLayer;
    if (((pIVar35->DC).NavLayersActiveMask & 2) == 0) {
      IVar30 = ImGuiNavLayer_Main;
      if (IVar7 == ImGuiNavLayer_Main) goto LAB_00133351;
    }
    else if (IVar7 == ImGuiNavLayer_Main) {
      pIVar35->NavLastIds[1] = 0;
    }
    else {
      IVar30 = IVar7 ^ ImGuiNavLayer_Menu;
    }
    NavRestoreLayer(IVar30);
    pIVar18 = GImGui;
    pIVar18->NavMousePosDirty = true;
    pIVar18->NavDisableHighlight = false;
    pIVar18->NavDisableMouseHover = true;
  }
LAB_00133351:
  local_a8 = (char)uVar53;
  if (((uVar50 & 1) == 0 && local_a8 == '\0') || (pIVar51->NavWindow == (ImGuiWindow *)0x0)) {
    (pIVar51->IO).NavActive = false;
LAB_0013339d:
    bVar22 = pIVar51->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  else {
    bVar22 = (pIVar51->NavWindow->Flags & 0x40000U) == 0;
    (pIVar51->IO).NavActive = bVar22;
    if (((!bVar22) || (pIVar51->NavId == 0)) ||
       (bVar22 = true, pIVar51->NavDisableHighlight != false)) goto LAB_0013339d;
  }
  (pIVar51->IO).NavVisible = bVar22;
  pIVar18 = GImGui;
  bVar22 = IsNavInputTest(1,ImGuiInputReadMode_Pressed);
  if (bVar22) {
    if (pIVar18->ActiveId == 0) {
      if (pIVar18->NavLayer == ImGuiNavLayer_Main) {
        pIVar35 = pIVar18->NavWindow;
        if (pIVar35 == (ImGuiWindow *)0x0) {
          if (0 < (pIVar18->OpenPopupStack).Size) {
LAB_00133999:
            pIVar36 = ImVector<ImGuiPopupData>::back(&pIVar18->OpenPopupStack);
            if ((pIVar36->Window->Flags & 0x8000000) == 0) {
              ClosePopupToLevel((pIVar18->OpenPopupStack).Size + -1,true);
            }
            goto LAB_00133411;
          }
        }
        else {
          if (((pIVar35 != pIVar35->RootWindow) && ((pIVar35->Flags & 0x4000000) == 0)) &&
             (pIVar43 = pIVar35->ParentWindow, pIVar43 != (ImGuiWindow *)0x0)) {
            if (pIVar35->ChildId == 0) {
              __assert_fail("child_window->ChildId != 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                            ,0x28fa,"void ImGui::NavUpdateCancelRequest()");
            }
            child_rect = ImGuiWindow::Rect(pIVar35);
            FocusWindow(pIVar43);
            IVar41 = pIVar35->ChildId;
            local_48 = WindowRectAbsToRel(pIVar43,&child_rect);
            SetNavID(IVar41,ImGuiNavLayer_Main,0,&local_48);
            goto LAB_001333fa;
          }
          if (0 < (pIVar18->OpenPopupStack).Size) goto LAB_00133999;
          if ((pIVar35->Flags & 0x5000000U) != 0x1000000) {
            pIVar35->NavLastIds[0] = 0;
          }
        }
        pIVar18->NavId = 0;
        pIVar18->NavFocusScopeId = 0;
      }
      else {
        NavRestoreLayer(ImGuiNavLayer_Main);
LAB_001333fa:
        pIVar18 = GImGui;
        pIVar18->NavMousePosDirty = true;
        pIVar18->NavDisableHighlight = false;
        pIVar18->NavDisableMouseHover = true;
      }
    }
    else if ((GImGui->ActiveIdUsingNavInputMask & 2) == 0) {
      ClearActiveID();
    }
  }
LAB_00133411:
  pIVar51->NavActivateFlags = 0;
  pIVar51->NavActivateId = 0;
  pIVar51->NavActivateDownId = 0;
  pIVar51->NavActivatePressedId = 0;
  pIVar51->NavActivateInputId = 0;
  if (((pIVar51->NavId == 0) || (pIVar51->NavDisableHighlight != false)) ||
     (pIVar51->NavWindowingTarget != (ImGuiWindow *)0x0)) {
LAB_0013344d:
    if ((pIVar51->NavWindow != (ImGuiWindow *)0x0) && ((pIVar51->NavWindow->Flags & 0x40000) != 0))
    {
      pIVar51->NavDisableHighlight = true;
    }
  }
  else if (pIVar51->NavWindow != (ImGuiWindow *)0x0) {
    if ((pIVar51->NavWindow->Flags & 0x40000) != 0) goto LAB_0013344d;
    fVar55 = (GImGui->IO).NavInputs[0];
    fVar63 = (GImGui->IO).NavInputs[2];
    if (0.0 < fVar55) {
      bVar22 = IsNavInputTest(0,ImGuiInputReadMode_Pressed);
    }
    else {
      bVar22 = false;
    }
    if (fVar63 <= 0.0) {
      bVar23 = false;
    }
    else {
      bVar23 = IsNavInputTest(2,ImGuiInputReadMode_Pressed);
    }
    IVar41 = pIVar51->ActiveId;
    if (bVar22 == true && IVar41 == 0) {
      pIVar51->NavActivateId = pIVar51->NavId;
      pIVar51->NavActivateFlags = 2;
LAB_00133a8e:
      if (bVar23 != false) {
        pIVar51->NavActivateInputId = pIVar51->NavId;
        pIVar51->NavActivateFlags = 1;
      }
      if (0.0 < fVar55) {
        pIVar51->NavActivateDownId = pIVar51->NavId;
      }
      if (bVar22 == false) goto LAB_0013344d;
      IVar41 = pIVar51->NavId;
    }
    else {
      if (IVar41 == 0) goto LAB_00133a8e;
      IVar27 = pIVar51->NavId;
      if ((bVar23 & IVar41 == IVar27) != 0) {
        pIVar51->NavActivateInputId = IVar41;
        pIVar51->NavActivateFlags = 1;
      }
      if (IVar41 == IVar27 && 0.0 < fVar55) {
        pIVar51->NavActivateDownId = IVar41;
      }
      if ((bVar22 & IVar41 == IVar27) == 0) goto LAB_0013344d;
    }
    pIVar51->NavActivatePressedId = IVar41;
    goto LAB_0013344d;
  }
  if ((pIVar51->NavActivateId != 0) && (pIVar51->NavActivateDownId != pIVar51->NavActivateId)) {
    __assert_fail("g.NavActivateDownId == g.NavActivateId",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x27a8,"void ImGui::NavUpdate()");
  }
  IVar41 = pIVar51->NavNextActivateId;
  if (IVar41 != 0) {
    if ((pIVar51->NavNextActivateFlags & 1U) == 0) {
      pIVar51->NavActivatePressedId = IVar41;
      pIVar51->NavActivateDownId = IVar41;
      pIVar51->NavActivateId = IVar41;
    }
    else {
      pIVar51->NavActivateInputId = IVar41;
    }
    pIVar51->NavActivateFlags = pIVar51->NavNextActivateFlags;
  }
  pIVar51->NavNextActivateId = 0;
  pIVar18 = GImGui;
  pIVar35 = GImGui->NavWindow;
  if ((pIVar35 != (ImGuiWindow *)0x0 & GImGui->NavMoveForwardToNextFrame) == 1) {
    iVar44 = GImGui->NavMoveDir;
    if ((iVar44 == -1) || (GImGui->NavMoveClipDir == -1)) {
      __assert_fail("g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None",
                    "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                    ,0x280b,"void ImGui::NavUpdateCreateMoveRequest()");
    }
    if ((GImGui->NavMoveFlags & 0x80) == 0) {
      __assert_fail("g.NavMoveFlags & ImGuiNavMoveFlags_Forwarded",
                    "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                    ,0x280c,"void ImGui::NavUpdateCreateMoveRequest()");
    }
LAB_0013365f:
    pIVar17 = GImGui;
    fVar55 = 0.0;
    if ((iVar44 == -1) && (((pIVar18->IO).ConfigFlags & 1U) != 0)) {
      pIVar43 = GImGui->NavWindow;
      if (((pIVar43->Flags & 0x40000) == 0) && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)) {
        bVar23 = IsKeyDown(0x205);
        bVar22 = false;
        bVar24 = false;
        if (bVar23) {
          bVar24 = IsActiveIdUsingKey(0x205);
          bVar24 = !bVar24;
        }
        bVar23 = IsKeyDown(0x206);
        if (bVar23) {
          bVar22 = IsActiveIdUsingKey(0x206);
          bVar22 = !bVar22;
        }
        bVar23 = IsKeyPressed(0x207,true);
        if (bVar23) {
          bVar23 = IsActiveIdUsingKey(0x207);
          bVar23 = !bVar23;
        }
        else {
          bVar23 = false;
        }
        bVar25 = IsKeyPressed(0x208,true);
        if (bVar25) {
          bVar25 = IsActiveIdUsingKey(0x208);
          bVar25 = !bVar25;
        }
        else {
          bVar25 = false;
        }
        if (!(bool)(bVar24 == bVar22 & (bVar23 ^ bVar25 ^ 1U))) {
          if (pIVar17->NavLayer != ImGuiNavLayer_Main) {
            NavRestoreLayer(ImGuiNavLayer_Main);
          }
          if (((pIVar43->DC).NavLayersActiveMask == 0) && ((pIVar43->DC).NavHasScroll == true)) {
            bVar22 = IsKeyPressed(0x205,true);
            if (bVar22) {
              (pIVar43->ScrollTarget).y =
                   (pIVar43->Scroll).y - ((pIVar43->InnerRect).Max.y - (pIVar43->InnerRect).Min.y);
              (pIVar43->ScrollTargetCenterRatio).y = 0.0;
              (pIVar43->ScrollTargetEdgeSnapDist).y = 0.0;
            }
            else {
              bVar22 = IsKeyPressed(0x206,true);
              if (!bVar22) {
                fVar55 = 0.0;
                if (bVar23) {
                  (pIVar43->ScrollTarget).y = 0.0;
                }
                else {
                  if (!bVar25) goto LAB_00133c56;
                  (pIVar43->ScrollTarget).y = (pIVar43->ScrollMax).y;
                }
                (pIVar43->ScrollTargetCenterRatio).y = 0.0;
                (pIVar43->ScrollTargetEdgeSnapDist).y = 0.0;
                goto LAB_00133c56;
              }
              (pIVar43->ScrollTarget).y =
                   ((pIVar43->InnerRect).Max.y - (pIVar43->InnerRect).Min.y) + (pIVar43->Scroll).y;
              (pIVar43->ScrollTargetCenterRatio).y = 0.0;
              (pIVar43->ScrollTargetEdgeSnapDist).y = 0.0;
            }
            goto LAB_00133c53;
          }
          uVar49 = (ulong)pIVar17->NavLayer;
          fVar55 = (pIVar43->InnerRect).Max.y;
          fVar63 = (pIVar43->InnerRect).Min.y;
          fVar56 = ImGuiWindow::CalcFontSize(pIVar43);
          fVar55 = (pIVar43->NavRectRel[uVar49].Max.y - pIVar43->NavRectRel[uVar49].Min.y) +
                   ((fVar55 - fVar63) - fVar56);
          fVar55 = (float)(~-(uint)(fVar55 <= 0.0) & (uint)fVar55);
          local_38 = uVar49 * 0x10;
          bVar22 = IsKeyPressed(0x205,true);
          if (bVar22) {
            fVar55 = -fVar55;
            IVar42 = 2;
            IVar31 = 3;
          }
          else {
            bVar22 = IsKeyPressed(0x206,true);
            if (!bVar22) {
              pfVar38 = (float *)((long)&pIVar43->NavRectRel[0].Min.x + local_38);
              if (bVar23) {
                *(undefined4 *)((long)&pIVar43->NavRectRel[0].Max.y + local_38) = 0;
                *(undefined4 *)((long)&pIVar43->NavRectRel[0].Min.y + local_38) = 0;
                pfVar47 = (float *)((long)&pIVar43->NavRectRel[0].Max.x + local_38);
                if (*pfVar47 <= *pfVar38 && *pfVar38 != *pfVar47) {
                  *(undefined4 *)((long)&pIVar43->NavRectRel[0].Max.x + local_38) = 0;
                  *pfVar38 = 0.0;
                }
                pIVar17->NavMoveDir = 3;
                pIVar17->NavMoveFlags = 0x50;
                fVar55 = 0.0;
                goto LAB_00133c56;
              }
              if (bVar25) {
                fVar55 = (pIVar43->ContentSize).y;
                *(float *)((long)&pIVar43->NavRectRel[0].Max.y + local_38) = fVar55;
                *(float *)((long)&pIVar43->NavRectRel[0].Min.y + local_38) = fVar55;
                pfVar47 = (float *)((long)&pIVar43->NavRectRel[0].Max.x + local_38);
                if (*pfVar47 <= *pfVar38 && *pfVar38 != *pfVar47) {
                  *(undefined4 *)((long)&pIVar43->NavRectRel[0].Max.x + local_38) = 0;
                  *pfVar38 = 0.0;
                }
                pIVar17->NavMoveDir = 2;
                pIVar17->NavMoveFlags = 0x50;
              }
              goto LAB_00133bfd;
            }
            IVar31 = 2;
            IVar42 = 3;
          }
          pIVar17->NavMoveDir = IVar31;
          pIVar17->NavMoveClipDir = IVar42;
          pIVar17->NavMoveFlags = 0x30;
          if ((fVar55 != 0.0) || (NAN(fVar55))) {
            IVar57 = (pIVar35->InnerRect).Max;
            (pIVar18->NavScoringNoClipRect).Min = (pIVar35->InnerRect).Min;
            (pIVar18->NavScoringNoClipRect).Max = IVar57;
            (pIVar18->NavScoringNoClipRect).Min.y = (pIVar18->NavScoringNoClipRect).Min.y + fVar55;
            (pIVar18->NavScoringNoClipRect).Max.y = (pIVar18->NavScoringNoClipRect).Max.y + fVar55;
          }
          goto LAB_00133c56;
        }
      }
LAB_00133bfd:
      fVar55 = 0.0;
    }
  }
  else {
    GImGui->NavMoveDir = -1;
    pIVar18->NavMoveFlags = 0;
    pIVar18->NavMoveScrollFlags = 0;
    if (((pIVar35 != (ImGuiWindow *)0x0) && (pIVar18->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar35->Flags & 0x40000) == 0)) {
      if (((pIVar18->ActiveIdUsingNavDirMask & 1) == 0) &&
         ((bVar22 = IsNavInputTest(4,ImGuiInputReadMode_Repeat), bVar22 ||
          (bVar22 = IsNavInputTest(0x10,ImGuiInputReadMode_Repeat), bVar22)))) {
        pIVar18->NavMoveDir = 0;
      }
      if (((GImGui->ActiveIdUsingNavDirMask & 2) == 0) &&
         ((bVar22 = IsNavInputTest(5,ImGuiInputReadMode_Repeat), bVar22 ||
          (bVar22 = IsNavInputTest(0x11,ImGuiInputReadMode_Repeat), bVar22)))) {
        pIVar18->NavMoveDir = 1;
      }
      if (((GImGui->ActiveIdUsingNavDirMask & 4) == 0) &&
         ((bVar22 = IsNavInputTest(6,ImGuiInputReadMode_Repeat), bVar22 ||
          (bVar22 = IsNavInputTest(0x12,ImGuiInputReadMode_Repeat), bVar22)))) {
        pIVar18->NavMoveDir = 2;
      }
      if (((GImGui->ActiveIdUsingNavDirMask & 8) == 0) &&
         ((bVar22 = IsNavInputTest(7,ImGuiInputReadMode_Repeat), bVar22 ||
          (bVar22 = IsNavInputTest(0x13,ImGuiInputReadMode_Repeat), bVar22)))) {
        pIVar18->NavMoveDir = 3;
      }
    }
    iVar44 = pIVar18->NavMoveDir;
    pIVar18->NavMoveClipDir = iVar44;
    (pIVar18->NavScoringNoClipRect).Min.x = 3.4028235e+38;
    (pIVar18->NavScoringNoClipRect).Min.y = 3.4028235e+38;
    (pIVar18->NavScoringNoClipRect).Max.x = -3.4028235e+38;
    (pIVar18->NavScoringNoClipRect).Max.y = -3.4028235e+38;
    if (pIVar35 != (ImGuiWindow *)0x0) goto LAB_0013365f;
LAB_00133c53:
    fVar55 = 0.0;
  }
LAB_00133c56:
  pIVar18->NavMoveForwardToNextFrame = false;
  if (pIVar18->NavMoveDir != -1) {
    NavMoveRequestSubmit
              (pIVar18->NavMoveDir,pIVar18->NavMoveClipDir,pIVar18->NavMoveFlags,
               pIVar18->NavMoveScrollFlags);
  }
  if (pIVar18->NavMoveSubmitted == true) {
    if (pIVar18->NavId == 0) {
      pIVar18->NavInitRequest = true;
      pIVar18->NavInitRequestFromMove = true;
      pIVar18->NavInitResultId = 0;
      pIVar18->NavDisableHighlight = false;
    }
    if ((pIVar18->NavInputSource != ImGuiInputSource_Gamepad) ||
       (pIVar18->NavLayer != ImGuiNavLayer_Main || pIVar35 == (ImGuiWindow *)0x0))
    goto LAB_00133e43;
    iVar44 = -(uint)((pIVar18->NavMoveFlags & 5U) == 0);
    iVar45 = -(uint)((pIVar18->NavMoveFlags & 10U) == 0);
    local_48.Min.y = (pIVar35->InnerRect).Min.y + -1.0;
    local_48.Min.x = (pIVar35->InnerRect).Min.x + -1.0;
    local_48.Max.x = (pIVar35->InnerRect).Max.x + 1.0;
    local_48.Max.y = (pIVar35->InnerRect).Max.y + 1.0;
    child_rect = WindowRectAbsToRel(pIVar35,&local_48);
    auVar68._4_4_ = iVar45;
    auVar68._0_4_ = iVar44;
    auVar68._8_4_ = 0xffffffff;
    auVar68._12_4_ = 0xffffffff;
    auVar62._4_4_ = iVar45;
    auVar62._0_4_ = iVar45;
    auVar62._8_4_ = iVar45;
    auVar62._12_4_ = iVar45;
    if ((((auVar62 | auVar68) & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
       (bVar22 = ImRect::Contains(&child_rect,pIVar35->NavRectRel + pIVar18->NavLayer), !bVar22)) {
      local_68 = child_rect.Min.x;
      fStack_60 = child_rect.Max.x;
      fStack_5c = child_rect.Max.y;
      fVar63 = ImGuiWindow::CalcFontSize(pIVar35);
      fVar70 = child_rect.Max.y - child_rect.Min.y;
      fVar56 = ImGuiWindow::CalcFontSize(pIVar35);
      auVar64._0_4_ = fVar63 * 0.5;
      auVar64._4_4_ = fVar56 * 0.5;
      auVar64._8_4_ = extraout_XMM0_Db * 0.0;
      auVar64._12_4_ = extraout_XMM0_Db_00 * 0.0;
      auVar13._4_4_ = fVar70;
      auVar13._0_4_ = fStack_60 - local_68;
      auVar13._8_4_ = fStack_5c - fStack_60;
      auVar13._12_4_ = 0.0 - fStack_5c;
      auVar68 = minps(auVar13,auVar64);
      fVar63 = child_rect.Min.x;
      fVar56 = child_rect.Min.y;
      auVar11._4_4_ = child_rect.Max.x;
      auVar11._8_4_ = child_rect.Max.y;
      auVar11._0_4_ = fVar56 - extraout_XMM0_Db_00;
      auVar65._0_8_ = auVar11._0_8_ << 0x20;
      auVar65._8_4_ = child_rect.Max.x - auVar68._0_4_;
      auVar65._12_4_ = child_rect.Max.y - auVar68._4_4_;
      child_rect.Max =
           (ImVec2)(~CONCAT44(iVar45,iVar44) & 0x7f7fffff7f7fffff |
                   auVar65._8_8_ & CONCAT44(iVar45,iVar44));
      child_rect.Min =
           (ImVec2)(~CONCAT44(iVar45,iVar44) & 0xff7fffffff7fffff |
                   CONCAT44(auVar68._4_4_ + fVar56,auVar68._0_4_ + fVar63) & CONCAT44(iVar45,iVar44)
                   );
      ImRect::ClipWithFull(pIVar35->NavRectRel + pIVar18->NavLayer,&child_rect);
      pIVar18->NavId = 0;
      pIVar18->NavFocusScopeId = 0;
    }
LAB_00133e54:
    IVar30 = pIVar18->NavLayer;
    fVar63 = pIVar35->NavRectRel[IVar30].Min.x;
    pIVar5 = &pIVar35->NavRectRel[IVar30].Max;
    if ((pIVar5->x <= fVar63 && fVar63 != pIVar5->x) ||
       (fVar63 = pIVar35->NavRectRel[IVar30].Min.y, pfVar38 = &pIVar35->NavRectRel[IVar30].Max.y,
       *pfVar38 <= fVar63 && fVar63 != *pfVar38)) {
      local_48.Min.x = 0.0;
      local_48.Min.y = 0.0;
      local_48.Max.x = 0.0;
      local_48.Max.y = 0.0;
    }
    else {
      local_48.Min = pIVar35->NavRectRel[IVar30].Min;
      local_48.Max = pIVar35->NavRectRel[IVar30].Max;
    }
    IVar71 = WindowRectRelToAbs(pIVar35,&local_48);
    fVar56 = IVar71.Min.y + fVar55;
    auVar14._4_4_ = child_rect.Max.x;
    auVar14._8_4_ = child_rect.Max.y;
    auVar14._0_4_ = fVar56;
    child_rect._0_12_ = auVar14 << 0x20;
    fVar63 = IVar71.Min.x + 1.0;
    if (IVar71.Max.x <= fVar63) {
      fVar63 = IVar71.Max.x;
    }
    fVar55 = IVar71.Max.y + fVar55;
    child_rect.Max.y = fVar55;
    child_rect.Min.x = fVar63;
    child_rect.Max.x = fVar63;
    if (fVar55 < fVar56) {
      __assert_fail("!scoring_rect.IsInverted()",
                    "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                    ,0x2865,"void ImGui::NavUpdateCreateMoveRequest()");
    }
  }
  else {
LAB_00133e43:
    child_rect = (ImRect)ZEXT816(0);
    if (pIVar35 != (ImGuiWindow *)0x0) goto LAB_00133e54;
  }
  (pIVar18->NavScoringRect).Min = child_rect.Min;
  (pIVar18->NavScoringRect).Max = child_rect.Max;
  ImRect::Add(&pIVar18->NavScoringNoClipRect,&child_rect);
  pIVar18 = GImGui;
  if (pIVar51->NavMoveDir == -1) {
    if (GImGui->NavMoveDir != -1) {
      __assert_fail("g.NavMoveDir == ImGuiDir_None",
                    "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                    ,0x2871,"void ImGui::NavUpdateCreateTabbingRequest()");
    }
    pIVar35 = GImGui->NavWindow;
    if ((((((pIVar35 != (ImGuiWindow *)0x0) && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0))
          && ((pIVar35->Flags & 0x40000) == 0)) &&
         ((bVar22 = IsKeyPressed(0x200,true), bVar22 &&
          (bVar22 = IsActiveIdUsingKey(0x200), !bVar22)))) && ((pIVar18->IO).KeyCtrl == false)) &&
       ((pIVar18->IO).KeyAlt == false)) {
      if ((pIVar18->IO).KeyShift == false) {
        uVar53 = (uint)(pIVar18->ActiveId != 0);
      }
      else {
        uVar53 = 0xffffffff;
      }
      pIVar18->NavTabbingDir = uVar53;
      scroll_flags = 3;
      if (pIVar35->Appearing != false) {
        scroll_flags = 0x21;
      }
      NavMoveRequestSubmit(-1,uVar53 >> 0x1f ^ 3,0x400,scroll_flags);
      (pIVar18->NavTabbingResultFirst).InFlags = 0;
      (pIVar18->NavTabbingResultFirst).Window = (ImGuiWindow *)0x0;
      (pIVar18->NavTabbingResultFirst).ID = 0;
      (pIVar18->NavTabbingResultFirst).FocusScopeId = 0;
      (pIVar18->NavTabbingResultFirst).DistAxial = 3.4028235e+38;
      (pIVar18->NavTabbingResultFirst).DistBox = 3.4028235e+38;
      (pIVar18->NavTabbingResultFirst).DistCenter = 3.4028235e+38;
      pIVar18->NavTabbingCounter = -1;
    }
  }
  NavUpdateAnyRequestFlag();
  pIVar51->NavIdIsAlive = false;
  pIVar35 = pIVar51->NavWindow;
  if (((pIVar35 != (ImGuiWindow *)0x0) && ((pIVar35->Flags & 0x40000) == 0)) &&
     (pIVar51->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar55 = ImGuiWindow::CalcFontSize(pIVar35);
    fVar55 = (float)(int)(fVar55 * 100.0 * (pIVar51->IO).DeltaTime + 0.5);
    if (((pIVar35->DC).NavLayersActiveMask == 0) &&
       (uVar53 = pIVar51->NavMoveDir, (uVar53 != 0xffffffff & (pIVar35->DC).NavHasScroll) == 1)) {
      if (uVar53 < 2) {
        (pIVar35->ScrollTarget).x =
             (float)(int)(*(float *)(&DAT_00185910 + (ulong)(uVar53 == 0) * 4) * fVar55 +
                         (pIVar35->Scroll).x);
        (pIVar35->ScrollTargetCenterRatio).x = 0.0;
        (pIVar35->ScrollTargetEdgeSnapDist).x = 0.0;
      }
      if ((uVar53 & 0xfffffffe) == 2) {
        (pIVar35->ScrollTarget).y =
             (float)(int)(*(float *)(&DAT_00185910 + (ulong)(uVar53 == 2) * 4) * fVar55 +
                         (pIVar35->Scroll).y);
        (pIVar35->ScrollTargetCenterRatio).y = 0.0;
        (pIVar35->ScrollTargetEdgeSnapDist).y = 0.0;
      }
    }
    IVar57 = GetNavInputAmount2d(8,ImGuiInputReadMode_Down,0.1,10.0);
    fVar63 = IVar57.x;
    fVar56 = IVar57.y;
    if (((fVar63 != 0.0) || (NAN(fVar63))) && (pIVar35->ScrollbarX == true)) {
      (pIVar35->ScrollTarget).x = (float)(int)(fVar63 * fVar55 + (pIVar35->Scroll).x);
      (pIVar35->ScrollTargetCenterRatio).x = 0.0;
      (pIVar35->ScrollTargetEdgeSnapDist).x = 0.0;
    }
    if ((fVar56 != 0.0) || (NAN(fVar56))) {
      (pIVar35->ScrollTarget).y = (float)(int)(fVar56 * fVar55 + (pIVar35->Scroll).y);
      (pIVar35->ScrollTargetCenterRatio).y = 0.0;
      (pIVar35->ScrollTargetEdgeSnapDist).y = 0.0;
    }
  }
  if ((uVar50 & 1) == 0 && local_a8 == '\0') {
    pIVar51->NavDisableHighlight = true;
    pIVar51->NavDisableMouseHover = false;
  }
  else if (((bVar21) && (((pIVar51->IO).ConfigFlags & 4) != 0)) &&
          (((pIVar51->IO).BackendFlags & 4) != 0)) {
    IVar57 = NavCalcPreferredRefPos();
    (pIVar51->IO).MousePosPrev = IVar57;
    (pIVar51->IO).MousePos = IVar57;
    (pIVar51->IO).WantSetMousePos = true;
  }
  pIVar51->NavScoringDebugCount = 0;
  pIVar51 = GImGui;
  pIVar5 = &(GImGui->IO).MousePos;
  bVar21 = IsMousePosValid(pIVar5);
  if (bVar21) {
    fVar55 = ImFloorSigned((pIVar51->IO).MousePos.x);
    fVar63 = ImFloorSigned((pIVar51->IO).MousePos.y);
    (pIVar51->MouseLastValidPos).x = fVar55;
    (pIVar51->MouseLastValidPos).y = fVar63;
    (pIVar51->IO).MousePos.x = fVar55;
    (pIVar51->IO).MousePos.y = fVar63;
  }
  bVar21 = IsMousePosValid(pIVar5);
  if ((bVar21) && (bVar21 = IsMousePosValid(&(pIVar51->IO).MousePosPrev), bVar21)) {
    IVar57 = (pIVar51->IO).MousePos;
    IVar58 = (pIVar51->IO).MousePosPrev;
    IVar59.x = IVar57.x - IVar58.x;
    IVar59.y = IVar57.y - IVar58.y;
    (pIVar51->IO).MouseDelta = IVar59;
    if ((((IVar59.x != 0.0) || (NAN(IVar59.x))) || (IVar59.y != 0.0)) || (NAN(IVar59.y))) {
      pIVar51->NavDisableMouseHover = false;
    }
  }
  else {
    (pIVar51->IO).MouseDelta.x = 0.0;
    (pIVar51->IO).MouseDelta.y = 0.0;
  }
  (pIVar51->IO).MousePosPrev = (pIVar51->IO).MousePos;
  for (lVar33 = 0; lVar33 != 5; lVar33 = lVar33 + 1) {
    if ((pIVar51->IO).MouseDown[lVar33] == true) {
      fVar55 = (pIVar51->IO).MouseDownDuration[lVar33];
      pbVar46 = (pIVar51->IO).MouseClicked + lVar33;
      *pbVar46 = fVar55 < 0.0;
      (pIVar51->IO).MouseClickedCount[lVar33] = 0;
      pbVar46[0x1e] = false;
      (pIVar51->IO).MouseDownDurationPrev[lVar33] = fVar55;
      if (0.0 <= fVar55) {
        (pIVar51->IO).MouseDownDuration[lVar33] = fVar55 + (pIVar51->IO).DeltaTime;
        bVar21 = IsMousePosValid(pIVar5);
        fVar55 = 0.0;
        if (bVar21) {
          fVar55 = (pIVar51->IO).MousePos.x - (pIVar51->IO).MouseClickedPos[lVar33].x;
          fVar63 = (pIVar51->IO).MousePos.y - (pIVar51->IO).MouseClickedPos[lVar33].y;
          fVar55 = fVar55 * fVar55 + fVar63 * fVar63;
        }
        fVar63 = (pIVar51->IO).MouseDragMaxDistanceSqr[lVar33];
        uVar53 = -(uint)(fVar55 <= fVar63);
        (pIVar51->IO).MouseDragMaxDistanceSqr[lVar33] =
             (float)(~uVar53 & (uint)fVar55 | (uint)fVar63 & uVar53);
        IVar26 = (pIVar51->IO).MouseClickedCount[lVar33];
      }
      else {
        (pIVar51->IO).MouseDownDuration[lVar33] = 0.0;
        if ((pIVar51->IO).MouseDoubleClickTime <=
            (float)(pIVar51->Time - (pIVar51->IO).MouseClickedTime[lVar33])) {
LAB_00134368:
          (pIVar51->IO).MouseClickedLastCount[lVar33] = 1;
        }
        else {
          bVar21 = IsMousePosValid(pIVar5);
          fVar55 = 0.0;
          fVar63 = 0.0;
          if (bVar21) {
            IVar57 = (pIVar51->IO).MousePos;
            IVar58 = (pIVar51->IO).MouseClickedPos[lVar33];
            fVar55 = IVar57.x - IVar58.x;
            fVar63 = IVar57.y - IVar58.y;
          }
          fVar56 = (pIVar51->IO).MouseDoubleClickMaxDist;
          if (fVar56 * fVar56 <= fVar55 * fVar55 + fVar63 * fVar63) goto LAB_00134368;
          pIVar6 = (pIVar51->IO).MouseClickedLastCount + lVar33;
          *pIVar6 = *pIVar6 + 1;
        }
        (pIVar51->IO).MouseClickedTime[lVar33] = pIVar51->Time;
        (pIVar51->IO).MouseClickedPos[lVar33] = (pIVar51->IO).MousePos;
        IVar26 = (pIVar51->IO).MouseClickedLastCount[lVar33];
        (pIVar51->IO).MouseClickedCount[lVar33] = IVar26;
        (pIVar51->IO).MouseDragMaxDistanceSqr[lVar33] = 0.0;
      }
    }
    else {
      (pIVar51->IO).MouseClicked[lVar33] = false;
      (pIVar51->IO).MouseClickedCount[lVar33] = 0;
      fVar55 = (pIVar51->IO).MouseDownDuration[lVar33];
      (pIVar51->IO).MouseReleased[lVar33] = 0.0 <= fVar55;
      pbVar46 = (pIVar51->IO).MouseClicked + lVar33;
      (pIVar51->IO).MouseDownDurationPrev[lVar33] = fVar55;
      (pIVar51->IO).MouseDownDuration[lVar33] = -1.0;
      IVar26 = 0;
    }
    (pIVar51->IO).MouseDoubleClicked[lVar33] = IVar26 == 2;
    if (*pbVar46 == true) {
      pIVar51->NavDisableMouseHover = false;
    }
  }
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar35 = GetTopMostPopupModal();
  if ((pIVar35 != (ImGuiWindow *)0x0) ||
     ((ctx->NavWindowingTarget != (ImGuiWindow *)0x0 && (0.0 < ctx->NavWindowingHighlightAlpha)))) {
    fVar55 = (ctx->IO).DeltaTime * 6.0 + ctx->DimBgRatio;
    if (1.0 <= fVar55) {
      fVar55 = 1.0;
    }
    ctx->DimBgRatio = fVar55;
  }
  else {
    fVar55 = (ctx->IO).DeltaTime * -10.0 + ctx->DimBgRatio;
    ctx->DimBgRatio = (float)(-(uint)(0.0 <= fVar55) & (uint)fVar55);
  }
  ctx->MouseCursor = 0;
  ctx->WantTextInputNextFrame = -1;
  ctx->WantCaptureMouseNextFrame = -1;
  ctx->WantCaptureKeyboardNextFrame = -1;
  uVar19 = *(undefined3 *)&(ctx->PlatformImeData).field_0x1;
  fVar55 = (ctx->PlatformImeData).InputPos.x;
  uVar12 = *(undefined8 *)&(ctx->PlatformImeData).InputPos.y;
  (ctx->PlatformImeDataPrev).WantVisible = (ctx->PlatformImeData).WantVisible;
  *(undefined3 *)&(ctx->PlatformImeDataPrev).field_0x1 = uVar19;
  (ctx->PlatformImeDataPrev).InputPos.x = fVar55;
  *(undefined8 *)&(ctx->PlatformImeDataPrev).InputPos.y = uVar12;
  (ctx->PlatformImeData).WantVisible = false;
  pIVar51 = GImGui;
  if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
    GImGui->WheelingWindowTimer = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
    bVar21 = IsMousePosValid((ImVec2 *)0x0);
    if (((bVar21) &&
        (fVar63 = (pIVar51->IO).MousePos.x - (pIVar51->WheelingWindowRefMousePos).x,
        fVar56 = (pIVar51->IO).MousePos.y - (pIVar51->WheelingWindowRefMousePos).y,
        fVar55 = (pIVar51->IO).MouseDragThreshold,
        fVar55 * fVar55 < fVar63 * fVar63 + fVar56 * fVar56)) ||
       (pIVar51->WheelingWindowTimer <= 0.0)) {
      pIVar51->WheelingWindow = (ImGuiWindow *)0x0;
      pIVar51->WheelingWindowTimer = 0.0;
    }
  }
  fVar55 = (pIVar51->IO).MouseWheel;
  if ((((((fVar55 != 0.0) || (fVar63 = (pIVar51->IO).MouseWheelH, fVar63 != 0.0)) || (NAN(fVar63)))
       && ((pIVar51->ActiveId == 0 || (pIVar51->ActiveIdUsingMouseWheel == false)))) &&
      ((pIVar51->HoveredIdPreviousFrame == 0 ||
       (pIVar51->HoveredIdPreviousFrameUsingMouseWheel == false)))) &&
     (((pIVar35 = pIVar51->WheelingWindow, pIVar35 != (ImGuiWindow *)0x0 ||
       (pIVar35 = pIVar51->HoveredWindow, pIVar35 != (ImGuiWindow *)0x0)) &&
      (pIVar35->Collapsed == false)))) {
    bVar21 = (pIVar51->IO).KeyCtrl;
    if ((fVar55 != 0.0) || (NAN(fVar55))) {
      if ((bVar21 & 1U) == 0) goto LAB_00134ab3;
      if ((pIVar51->IO).FontAllowUserScaling == true) {
        StartLockWheelingWindow(pIVar35);
        IVar71 = child_rect;
        fVar55 = pIVar35->FontWindowScale;
        fVar56 = (pIVar51->IO).MouseWheel * 0.1 + fVar55;
        fVar63 = 2.5;
        if (fVar56 <= 2.5) {
          fVar63 = fVar56;
        }
        fVar63 = (float)(-(uint)(fVar56 < 0.5) & 0x3f000000 | ~-(uint)(fVar56 < 0.5) & (uint)fVar63)
        ;
        pIVar35->FontWindowScale = fVar63;
        if (pIVar35 == pIVar35->RootWindow) {
          fVar63 = fVar63 / fVar55;
          IVar57 = pIVar35->Size;
          auVar66._8_8_ = 0;
          auVar66._0_4_ = IVar57.x;
          auVar66._4_4_ = IVar57.y;
          IVar58 = (pIVar51->IO).MousePos;
          fVar55 = (pIVar35->Pos).x;
          fVar56 = (pIVar35->Pos).y;
          auVar69._0_4_ = (IVar58.x - fVar55) * (1.0 - fVar63) * IVar57.x;
          auVar69._4_4_ = (IVar58.y - fVar56) * (1.0 - fVar63) * IVar57.y;
          auVar69._8_8_ = 0;
          auVar68 = divps(auVar69,auVar66);
          child_rect.Min.y = auVar68._4_4_ + fVar56;
          child_rect.Min.x = auVar68._0_4_ + fVar55;
          child_rect.Max = IVar71.Max;
          SetWindowPos(pIVar35,&child_rect.Min,0);
          IVar57 = pIVar35->SizeFull;
          IVar60.x = (float)(int)((pIVar35->Size).x * fVar63);
          IVar60.y = (float)(int)((pIVar35->Size).y * fVar63);
          pIVar35->Size = IVar60;
          (pIVar35->SizeFull).x = (float)(int)(IVar57.x * fVar63);
          (pIVar35->SizeFull).y = (float)(int)(IVar57.y * fVar63);
        }
      }
    }
    else if ((bVar21 & 1U) == 0) {
LAB_00134ab3:
      if (((pIVar51->IO).KeyShift != true) ||
         (local_b8 = fVar55, (pIVar51->IO).ConfigMacOSXBehaviors == true)) {
        local_b8 = (pIVar51->IO).MouseWheelH;
        if ((fVar55 != 0.0) || (NAN(fVar55))) {
          StartLockWheelingWindow(pIVar35);
          while ((uVar53 = pIVar35->Flags, (uVar53 >> 0x18 & 1) != 0 &&
                 (((uVar53 & 0x210) == 0x10 ||
                  ((fVar63 = (pIVar35->ScrollMax).y, fVar63 == 0.0 && (!NAN(fVar63)))))))) {
            pIVar35 = pIVar35->ParentWindow;
          }
          if ((uVar53 & 0x210) == 0) {
            fVar56 = ((pIVar35->InnerRect).Max.y - (pIVar35->InnerRect).Min.y) * 0.67;
            fVar70 = ImGuiWindow::CalcFontSize(pIVar35);
            fVar63 = fVar70 * 5.0;
            if (fVar56 <= fVar70 * 5.0) {
              fVar63 = fVar56;
            }
            (pIVar35->ScrollTarget).y = (pIVar35->Scroll).y - fVar55 * (float)(int)fVar63;
            (pIVar35->ScrollTargetCenterRatio).y = 0.0;
            (pIVar35->ScrollTargetEdgeSnapDist).y = 0.0;
          }
        }
      }
      if ((local_b8 != 0.0) || (NAN(local_b8))) {
        StartLockWheelingWindow(pIVar35);
        while ((uVar53 = pIVar35->Flags, (uVar53 >> 0x18 & 1) != 0 &&
               (((uVar53 & 0x210) == 0x10 ||
                ((fVar55 = (pIVar35->ScrollMax).x, fVar55 == 0.0 && (!NAN(fVar55)))))))) {
          pIVar35 = pIVar35->ParentWindow;
        }
        if ((uVar53 & 0x210) == 0) {
          fVar63 = ((pIVar35->InnerRect).Max.x - (pIVar35->InnerRect).Min.x) * 0.67;
          fVar56 = ImGuiWindow::CalcFontSize(pIVar35);
          fVar55 = fVar56 + fVar56;
          if (fVar63 <= fVar56 + fVar56) {
            fVar55 = fVar63;
          }
          (pIVar35->ScrollTarget).x = (pIVar35->Scroll).x - local_b8 * (float)(int)fVar55;
          (pIVar35->ScrollTargetCenterRatio).x = 0.0;
          (pIVar35->ScrollTargetEdgeSnapDist).x = 0.0;
        }
      }
    }
  }
  iVar44 = (ctx->Windows).Size;
  if (iVar44 < (ctx->WindowsFocusOrder).Size) {
    __assert_fail("g.WindowsFocusOrder.Size <= g.Windows.Size",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x111a,"void ImGui::NewFrame()");
  }
  local_b8 = 3.4028235e+38;
  if ((ctx->GcCompactAll == false) && (fVar55 = (ctx->IO).ConfigMemoryCompactTimer, 0.0 <= fVar55))
  {
    local_b8 = (float)ctx->Time - fVar55;
  }
  for (iVar45 = 0; iVar45 != iVar44; iVar45 = iVar45 + 1) {
    ppIVar37 = ImVector<ImGuiWindow_*>::operator[](&ctx->Windows,iVar45);
    pIVar35 = *ppIVar37;
    bVar21 = pIVar35->Active;
    pIVar35->WasActive = bVar21;
    pIVar35->BeginCount = 0;
    pIVar35->Active = false;
    pIVar35->WriteAccessed = false;
    if (((bVar21 == false) && (pIVar35->MemoryCompacted == false)) &&
       (pIVar35->LastTimeActive <= local_b8 && local_b8 != pIVar35->LastTimeActive)) {
      GcCompactTransientWindowBuffers(pIVar35);
    }
    iVar44 = (ctx->Windows).Size;
  }
  this_00 = &ctx->TablesLastTimeActive;
  for (iVar44 = 0; iVar44 < this_00->Size; iVar44 = iVar44 + 1) {
    pfVar38 = ImVector<float>::operator[](this_00,iVar44);
    if ((0.0 <= *pfVar38) &&
       (pfVar38 = ImVector<float>::operator[](this_00,iVar44),
       *pfVar38 <= local_b8 && local_b8 != *pfVar38)) {
      table = ImVector<ImGuiTable>::operator[](&(ctx->Tables).Buf,iVar44);
      TableGcCompactTransientBuffers(table);
    }
  }
  this_01 = &ctx->TablesTempData;
  for (iVar44 = 0; iVar44 < this_01->Size; iVar44 = iVar44 + 1) {
    pIVar39 = ImVector<ImGuiTableTempData>::operator[](this_01,iVar44);
    if ((0.0 <= pIVar39->LastTimeActive) &&
       (pIVar39 = ImVector<ImGuiTableTempData>::operator[](this_01,iVar44),
       pIVar39->LastTimeActive <= local_b8 && local_b8 != pIVar39->LastTimeActive)) {
      pIVar39 = ImVector<ImGuiTableTempData>::operator[](this_01,iVar44);
      TableGcCompactTransientBuffers(pIVar39);
    }
  }
  if (ctx->GcCompactAll != false) {
    GcCompactTransientMiscBuffers();
  }
  ctx->GcCompactAll = false;
  if ((ctx->NavWindow != (ImGuiWindow *)0x0) && (ctx->NavWindow->WasActive == false)) {
    FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
  }
  ImVector<ImGuiWindowStackData>::resize(&ctx->CurrentWindowStack,0);
  ImVector<ImGuiPopupData>::resize(&ctx->BeginPopupStack,0);
  ImVector<int>::resize(&ctx->ItemFlagsStack,0);
  auVar15._12_4_ = 0;
  auVar15._0_4_ = child_rect.Min.y;
  auVar15._4_4_ = child_rect.Max.x;
  auVar15._8_4_ = child_rect.Max.y;
  child_rect = (ImRect)(auVar15 << 0x20);
  ImVector<int>::push_back(&ctx->ItemFlagsStack,(int *)&child_rect);
  ImVector<ImGuiGroupData>::resize(&ctx->GroupStack,0);
  pIVar51 = GImGui;
  GImGui->DebugItemPickerBreakId = 0;
  if (pIVar51->DebugItemPickerActive == true) {
    uVar53 = pIVar51->HoveredIdPreviousFrame;
    pIVar51->MouseCursor = 7;
    bVar21 = IsKeyPressed(0x20e,true);
    if (bVar21) {
      pIVar51->DebugItemPickerActive = false;
    }
    pIVar18 = GImGui;
    fVar55 = (GImGui->IO).MouseDownDuration[0];
    if ((fVar55 != 0.0) || (NAN(fVar55))) {
      uVar50 = (uint)(uVar53 == 0);
    }
    else if (uVar53 == 0) {
      uVar50 = 1;
    }
    else {
      pIVar51->DebugItemPickerBreakId = uVar53;
      pIVar51->DebugItemPickerActive = false;
      uVar50 = 0;
    }
    pIVar2 = &pIVar18->NextWindowData;
    *(byte *)&pIVar2->Flags = (byte)pIVar2->Flags | 0x40;
    (pIVar18->NextWindowData).BgAlphaVal = 0.6;
    BeginTooltip();
    Text("HoveredId: 0x%08X",(ulong)uVar53);
    Text("Press ESC to abort picking.");
    TextColored((ImVec4 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uVar50 << 4)),
                "Click to break in debugger!");
    EndTooltip();
    pIVar51 = GImGui;
  }
  pIVar51->DebugHookIdInfo = 0;
  if (pIVar51->FrameCount != (pIVar51->DebugStackTool).LastActiveFrame + 1) goto LAB_00134b73;
  IVar41 = pIVar51->HoveredIdPreviousFrame;
  if (IVar41 == 0) {
    IVar41 = pIVar51->ActiveId;
  }
  if ((pIVar51->DebugStackTool).QueryId != IVar41) {
    (pIVar51->DebugStackTool).QueryId = IVar41;
    (pIVar51->DebugStackTool).StackLevel = -1;
    ImVector<ImGuiStackLevelInfo>::resize(&(pIVar51->DebugStackTool).Results,0);
  }
  if (IVar41 == 0) goto LAB_00134b73;
  iVar44 = (pIVar51->DebugStackTool).StackLevel;
  if (iVar44 < 0) {
LAB_00134b2f:
    if (iVar44 == -1) {
      pIVar51->DebugHookIdInfo = IVar41;
      goto LAB_00134b73;
    }
    if (iVar44 < 0) goto LAB_00134b73;
    iVar45 = (pIVar51->DebugStackTool).Results.Size;
  }
  else {
    iVar45 = (pIVar51->DebugStackTool).Results.Size;
    if (iVar44 < iVar45) {
      pIVar3 = &(pIVar51->DebugStackTool).Results;
      pIVar40 = ImVector<ImGuiStackLevelInfo>::operator[](pIVar3,iVar44);
      if ((pIVar40->QuerySuccess == false) &&
         (pIVar40 = ImVector<ImGuiStackLevelInfo>::operator[](pIVar3,iVar44),
         pIVar40->QueryFrameCount < '\x03')) {
        iVar44 = (pIVar51->DebugStackTool).StackLevel;
      }
      else {
        iVar44 = (pIVar51->DebugStackTool).StackLevel + 1;
        (pIVar51->DebugStackTool).StackLevel = iVar44;
      }
      goto LAB_00134b2f;
    }
  }
  if (iVar44 < iVar45) {
    pIVar3 = &(pIVar51->DebugStackTool).Results;
    pIVar40 = ImVector<ImGuiStackLevelInfo>::operator[](pIVar3,iVar44);
    pIVar51->DebugHookIdInfo = pIVar40->ID;
    pIVar40 = ImVector<ImGuiStackLevelInfo>::operator[](pIVar3,iVar44);
    pIVar40->QueryFrameCount = pIVar40->QueryFrameCount + '\x01';
  }
LAB_00134b73:
  ctx->WithinFrameScopeWithImplicitWindow = true;
  pIVar51 = GImGui;
  (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 2;
  (pIVar51->NextWindowData).SizeVal.x = 400.0;
  (pIVar51->NextWindowData).SizeVal.y = 400.0;
  (pIVar51->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  if (ctx->CurrentWindow->IsFallbackWindow != false) {
    CallContextHooks(ctx,ImGuiContextHookType_NewFramePost);
    return;
  }
  __assert_fail("g.CurrentWindow->IsFallbackWindow == true",
                "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                ,0x114a,"void ImGui::NewFrame()");
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

    // Remove pending delete hooks before frame start.
    // This deferred removal avoid issues of removal while iterating the hook vector
    for (int n = g.Hooks.Size - 1; n >= 0; n--)
        if (g.Hooks[n].Type == ImGuiContextHookType_PendingRemoval_)
            g.Hooks.erase(&g.Hooks[n]);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePre);

    // Check and assert for various common IO and Configuration mistakes
    ErrorCheckNewFrameSanityChecks();

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.FramerateSecPerFrameCount = ImMin(g.FramerateSecPerFrameCount + 1, IM_ARRAYSIZE(g.FramerateSecPerFrame));
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)g.FramerateSecPerFrameCount)) : FLT_MAX;

    UpdateViewportsNewFrame();

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    ImRect virtual_space(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    for (int n = 0; n < g.Viewports.Size; n++)
        virtual_space.Add(g.Viewports[n]->GetMainRect());
    g.DrawListSharedData.ClipRectFullscreen = virtual_space.ToVec4();
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleTessellationMaxError(g.Style.CircleTessellationMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedLinesUseTex && !(g.Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines))
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLinesUseTex;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataP.Clear();
    }

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredIdPreviousFrameUsingMouseWheel = g.HoveredIdUsingMouseWheel;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    g.HoveredIdUsingMouseWheel = false;
    g.HoveredIdDisabled = false;

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingNavInputMask = 0x00;
        g.ActiveIdUsingKeyInputMask.ClearAllBits();
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Close popups on focus lost (currently wip/opt-in)
    //if (g.IO.AppFocusLost)
    //    ClosePopupsExceptModals();

    // Process input queue (trickle as many events as possible)
    g.InputEventsTrail.resize(0);
    UpdateInputEvents(g.IO.ConfigInputTrickleEventQueue);

    // Update keyboard input state
    UpdateKeyboardInputs();

    //IM_ASSERT(g.IO.KeyCtrl == IsKeyDown(ImGuiKey_LeftCtrl) || IsKeyDown(ImGuiKey_RightCtrl));
    //IM_ASSERT(g.IO.KeyShift == IsKeyDown(ImGuiKey_LeftShift) || IsKeyDown(ImGuiKey_RightShift));
    //IM_ASSERT(g.IO.KeyAlt == IsKeyDown(ImGuiKey_LeftAlt) || IsKeyDown(ImGuiKey_RightAlt));
    //IM_ASSERT(g.IO.KeySuper == IsKeyDown(ImGuiKey_LeftSuper) || IsKeyDown(ImGuiKey_RightSuper));

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;

    // Platform IME data: reset for the frame
    g.PlatformImeDataPrev = g.PlatformImeData;
    g.PlatformImeData.WantVisible = false;

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size <= g.Windows.Size);
    const float memory_compact_start_time = (g.GcCompactAll || g.IO.ConfigMemoryCompactTimer < 0.0f) ? FLT_MAX : (float)g.Time - g.IO.ConfigMemoryCompactTimer;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Garbage collect transient buffers of recently unused tables
    for (int i = 0; i < g.TablesLastTimeActive.Size; i++)
        if (g.TablesLastTimeActive[i] >= 0.0f && g.TablesLastTimeActive[i] < memory_compact_start_time)
            TableGcCompactTransientBuffers(g.Tables.GetByIndex(i));
    for (int i = 0; i < g.TablesTempData.Size; i++)
        if (g.TablesTempData[i].LastTimeActive >= 0.0f && g.TablesTempData[i].LastTimeActive < memory_compact_start_time)
            TableGcCompactTransientBuffers(&g.TablesTempData[i]);
    if (g.GcCompactAll)
        GcCompactTransientMiscBuffers();
    g.GcCompactAll = false;

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    g.ItemFlagsStack.resize(0);
    g.ItemFlagsStack.push_back(ImGuiItemFlags_None);
    g.GroupStack.resize(0);

    // [DEBUG] Update debug features
    UpdateDebugToolItemPicker();
    UpdateDebugToolStackQueries();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400, 400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePost);
}